

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

bool __thiscall
mjs::object::do_redefine_own_property(object *this,string *name,value *val,property_attribute attr)

{
  bool bVar1;
  property_attribute a;
  gc_heap *h;
  gc_vector<mjs::object::property> *this_00;
  wstring_view local_68;
  wstring_view local_58;
  pair<mjs::object::property_*,_mjs::gc_vector<mjs::object::property>_*> local_48;
  property *local_38;
  property *it;
  value *pvStack_28;
  property_attribute attr_local;
  value *val_local;
  string *name_local;
  object *this_local;
  
  it._4_4_ = attr;
  pvStack_28 = val;
  val_local = (value *)name;
  name_local = (string *)this;
  local_58 = string::view(name);
  local_48 = find(this,local_58);
  local_38 = local_48.first;
  if (local_48.first == (property *)0x0) {
    local_68 = string::view((string *)val_local);
    a = own_property_attributes(this,&local_68);
    bVar1 = is_valid(a);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!is_valid(own_property_attributes(name.view()))",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object.cpp"
                    ,0x66,
                    "virtual bool mjs::object::do_redefine_own_property(const string &, const value &, property_attribute)"
                   );
    }
    h = heap(this);
    this_00 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::object::property>,_true>::dereference
                        (&this->properties_,h);
    gc_vector<mjs::object::property>::
    emplace_back<mjs::string_const&,mjs::value_const&,mjs::property_attribute&>
              (this_00,(string *)val_local,pvStack_28,(property_attribute *)((long)&it + 4));
  }
  else {
    bVar1 = has_attributes(it._4_4_,accessor);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!has_attributes(attr, property_attribute::accessor)",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object.cpp"
                    ,0x61,
                    "virtual bool mjs::object::do_redefine_own_property(const string &, const value &, property_attribute)"
                   );
    }
    property::attributes(local_38,it._4_4_);
    property::raw_put(local_38,pvStack_28);
  }
  return true;
}

Assistant:

bool object::do_redefine_own_property(const string& name, const value& val, property_attribute attr) {
    if (auto it = find(name.view()).first) {
        assert(!has_attributes(attr, property_attribute::accessor));
        it->attributes(attr);
        it->raw_put(val);
        return true;
    }
    assert(!is_valid(own_property_attributes(name.view())));
    properties_.dereference(heap()).emplace_back(name, val, attr);
    return true;
}